

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

ssize_t __thiscall
phosg::BitReader::pread(BitReader *this,int __fd,void *__buf,size_t __nbytes,__off_t __offset)

{
  logic_error *this_00;
  ulong uVar1;
  undefined4 in_register_00000034;
  size_t bit_offset;
  ulong uStack_38;
  uint8_t ret_bits;
  uint64_t ret;
  uint8_t size_local;
  size_t start_offset_local;
  BitReader *this_local;
  
  if (0x40 < (byte)__buf) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_00,"BitReader cannot return more than 64 bits at once");
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  uStack_38 = 0;
  for (bit_offset._7_1_ = 0; bit_offset._7_1_ < (byte)__buf; bit_offset._7_1_ = bit_offset._7_1_ + 1
      ) {
    uVar1 = CONCAT44(in_register_00000034,__fd) + (ulong)bit_offset._7_1_;
    uStack_38 = uStack_38 << 1 |
                (long)(int)((int)(uint)this->data[uVar1 >> 3] >> (7 - ((byte)uVar1 & 7) & 0x1f) & 1)
    ;
  }
  return uStack_38;
}

Assistant:

uint64_t BitReader::pread(size_t start_offset, uint8_t size) {
  if (size > 64) {
    throw logic_error("BitReader cannot return more than 64 bits at once");
  }

  uint64_t ret = 0;
  for (uint8_t ret_bits = 0; ret_bits < size; ret_bits++) {
    size_t bit_offset = start_offset + ret_bits;
    ret = (ret << 1) | ((this->data[bit_offset >> 3] >> (7 - (bit_offset & 7))) & 1);
  }
  return ret;
}